

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O2

void ConvertToYUVA(uint32_t *src,int width,int y_pos,WebPDecBuffer *output)

{
  uint8_t *puVar1;
  
  (*WebPConvertARGBToY)
            (src,(output->u).RGBA.rgba + (long)(output->u).YUVA.y_stride * (long)y_pos,width);
  (*WebPConvertARGBToUV)
            (src,(output->u).YUVA.u + (long)(output->u).YUVA.u_stride * (long)(y_pos >> 1),
             (output->u).YUVA.v + (long)(output->u).YUVA.v_stride * (long)(y_pos >> 1),width,
             ~y_pos & 1);
  puVar1 = (output->u).YUVA.a;
  if (puVar1 != (uint8_t *)0x0) {
    (*WebPExtractAlpha)((uint8_t *)((long)src + 3),0,width,1,
                        puVar1 + (long)(output->u).YUVA.a_stride * (long)y_pos,0);
    return;
  }
  return;
}

Assistant:

static void ConvertToYUVA(const uint32_t* const src, int width, int y_pos,
                          const WebPDecBuffer* const output) {
  const WebPYUVABuffer* const buf = &output->u.YUVA;

  // first, the luma plane
  WebPConvertARGBToY(src, buf->y + y_pos * buf->y_stride, width);

  // then U/V planes
  {
    uint8_t* const u = buf->u + (y_pos >> 1) * buf->u_stride;
    uint8_t* const v = buf->v + (y_pos >> 1) * buf->v_stride;
    // even lines: store values
    // odd lines: average with previous values
    WebPConvertARGBToUV(src, u, v, width, !(y_pos & 1));
  }
  // Lastly, store alpha if needed.
  if (buf->a != NULL) {
    uint8_t* const a = buf->a + y_pos * buf->a_stride;
#if defined(WORDS_BIGENDIAN)
    WebPExtractAlpha((uint8_t*)src + 0, 0, width, 1, a, 0);
#else
    WebPExtractAlpha((uint8_t*)src + 3, 0, width, 1, a, 0);
#endif
  }
}